

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O2

uint __thiscall
covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::insert
          (StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *es,bool accept,uint base)

{
  int iVar1;
  iterator it_1;
  StateEntry *pSVar2;
  node_pointer ppVar3;
  pointer puVar4;
  pointer puVar5;
  int iVar6;
  uint uVar7;
  emplace_return eVar8;
  StateEntry *entry;
  
  iVar1 = this->tempsz;
  puVar4 = (es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar6 = (int)((ulong)((long)puVar5 - (long)puVar4) >> 2);
  if (iVar1 < iVar6) {
    while (iVar1 < iVar6) {
      iVar1 = iVar1 * 2;
      this->tempsz = iVar1;
    }
    pSVar2 = (StateEntry *)realloc(this->temp,(long)(iVar1 * 2) * 4 + 8);
    this->temp = pSVar2;
    puVar4 = (es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar6 = (int)((ulong)((long)puVar5 - (long)puVar4) >> 2);
  }
  else {
    pSVar2 = this->temp;
  }
  pSVar2->sz = iVar6 + 1;
  pSVar2->data[0] = (uint)accept;
  uVar7 = 1;
  for (; puVar4 != puVar5; puVar4 = puVar4 + 1) {
    pSVar2->data[uVar7] = *puVar4;
    uVar7 = uVar7 + 1;
  }
  ppVar3 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>,_const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry>_>
           ::find_node(&(this->cache).table_,&this->temp);
  if (ppVar3 == (node_pointer)0x0) {
    entry = (StateEntry *)
            malloc(((long)(es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start) * 2 + 8);
    std::
    vector<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
    ::push_back(&this->entries,&entry);
    puVar4 = (es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    entry->sz = (int)((ulong)((long)puVar5 - (long)puVar4) >> 2) + 1;
    entry->data[0] = (uint)accept;
    uVar7 = 1;
    for (; puVar4 != puVar5; puVar4 = puVar4 + 1) {
      entry->data[uVar7] = *puVar4;
      uVar7 = uVar7 + 1;
    }
    eVar8 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::EqEntry>>
            ::
            try_emplace_unique<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::EqEntry>>
                        *)&this->cache,&entry);
    *(uint *)((long)&((eVar8.first.node_.node_)->value_base_).data_.data_ + 8) = base;
  }
  else {
    base = *(uint *)((long)&(ppVar3->value_base_).data_.data_ + 8);
  }
  return base;
}

Assistant:

unsigned int insert(Container & es, bool accept, unsigned int base){
         // Ensure there is enough space in temp for the edges
         if(tempsz < (int) es.size())
         {
           while(tempsz < (int) es.size())
           {
             tempsz *= 2;
           }
           temp = ((StateEntry*) realloc(temp, sizeof(StateEntry) + 
                                         (2*tempsz)*sizeof(unsigned int)));
         }
         // Load the edges into temp.
         temp->sz = es.size() + 1;
         temp->data[0] = accept;
         unsigned int ii=0;
         for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
         {
           temp->data[ii+1] = *it;
           ii++;
         }
         
         // Look for the temporary element in the map.
         typename StateCache::iterator it(cache.find(temp));
         if(it != cache.end())
           return (*it).second;
         // Look for the temporary element in the map.
         if(it != cache.end())
           return (*it).second;
         else 
         {
           StateEntry* entry = ((StateEntry*) malloc(sizeof(StateEntry) + 
                                                     (2*es.size())*sizeof(unsigned int))); 
           entries.push_back(entry);
           entry->sz = es.size() + 1; 
           entry->data[0] = accept;
           unsigned int ii=0;
           for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
           {
             entry->data[ii+1] = *it;
             ii++;
           }
           cache[entry] = base;
           return base;
         }
       }